

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpEventServer.cpp
# Opt level: O2

void __thiscall TcpEventServer::ErrorQuit(TcpEventServer *this,char *str)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  
  fputs(str,_stderr);
  piVar1 = __errno_location();
  __stream = _stderr;
  if (*piVar1 != 0) {
    pcVar2 = strerror(*piVar1);
    fprintf(__stream," : %s",pcVar2);
  }
  fputc(10,_stderr);
  exit(1);
}

Assistant:

void TcpEventServer::ErrorQuit(const char *str)
{
    //输出错误信息，退出程序
    fprintf(stderr, "%s", str);
    if( errno != 0 )
        fprintf(stderr, " : %s", strerror(errno));
    fprintf(stderr, "\n");
    exit(1);
}